

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O3

size_t __thiscall miniros::RPCManager::unbind(RPCManager *this,void *object)

{
  _Rb_tree_header *p_Var1;
  key_type *__k;
  pointer pbVar2;
  int iVar3;
  _Base_ptr p_Var4;
  pthread_mutex_t *__mutex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  key_type *pkVar5;
  size_t sVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
  pVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keysToRemove;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  pthread_mutex_t *local_38;
  
  if (object == (void *)0x0) {
    sVar6 = 0;
  }
  else {
    LOCK();
    (this->unbind_requested_)._M_base._M_i = true;
    UNLOCK();
    __mutex = (pthread_mutex_t *)&this->functions_mutex_;
    iVar3 = pthread_mutex_lock(__mutex);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var4 = (this->functions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->functions_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 == p_Var1) {
      pkVar5 = (key_type *)0x0;
    }
    else {
      local_38 = __mutex;
      do {
        if (*(void **)(p_Var4 + 5) == object) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_58,(value_type *)(p_Var4 + 1));
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        __mutex = local_38;
        pbVar2 = local_58.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        __k = local_58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        pkVar5 = local_58.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      } while ((_Rb_tree_header *)p_Var4 != p_Var1);
      for (; __k != pbVar2; __k = __k + 1) {
        pVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
                ::equal_range(&(this->functions_)._M_t,__k);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
        ::_M_erase_aux(&(this->functions_)._M_t,(_Base_ptr)pVar7.first._M_node,
                       (_Base_ptr)pVar7.second._M_node);
        pkVar5 = local_58.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    LOCK();
    (this->unbind_requested_)._M_base._M_i = false;
    UNLOCK();
    sVar6 = (long)local_58.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pkVar5 >> 5;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
    pthread_mutex_unlock(__mutex);
  }
  return sVar6;
}

Assistant:

size_t RPCManager::unbind(const void* object)
{
  if (!object)
    return 0;
  unbind_requested_ = true;
  std::scoped_lock<std::mutex> lock(functions_mutex_);
  std::vector<std::string> keysToRemove;
  for (const auto& [key, info]: functions_) {
    if (info.object == object) {
      keysToRemove.push_back(key);
    }
  }

  for (const auto& key: keysToRemove) {
    functions_.erase(key);
  }

  unbind_requested_ = false;
  return keysToRemove.size();
}